

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::add_msl_shader_output(CompilerMSL *this,MSLShaderInterfaceVariable *so)

{
  uint32_t uVar1;
  BuiltIn BVar2;
  MSLShaderVariableRate MVar3;
  MSLShaderInterfaceVariable *pMVar4;
  mapped_type *pmVar5;
  size_type sVar6;
  mapped_type *pmVar7;
  bool bVar8;
  BuiltIn local_28;
  BuiltIn local_24;
  key_type local_20;
  MSLShaderInterfaceVariable *local_18;
  MSLShaderInterfaceVariable *so_local;
  CompilerMSL *this_local;
  
  local_20.location = so->location;
  local_20.component = so->component;
  local_18 = so;
  so_local = (MSLShaderInterfaceVariable *)this;
  pmVar5 = ::std::
           map<spirv_cross::LocationComponentPair,_spirv_cross::MSLShaderInterfaceVariable,_std::less<spirv_cross::LocationComponentPair>,_std::allocator<std::pair<const_spirv_cross::LocationComponentPair,_spirv_cross::MSLShaderInterfaceVariable>_>_>
           ::operator[](&this->outputs_by_location,&local_20);
  uVar1 = so->component;
  pmVar5->location = so->location;
  pmVar5->component = uVar1;
  BVar2 = so->builtin;
  pmVar5->format = so->format;
  pmVar5->builtin = BVar2;
  MVar3 = so->rate;
  pmVar5->vecsize = so->vecsize;
  pmVar5->rate = MVar3;
  bVar8 = false;
  if (local_18->builtin != BuiltInMax) {
    local_24 = local_18->builtin;
    sVar6 = ::std::
            unordered_map<unsigned_int,_spirv_cross::MSLShaderInterfaceVariable,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>_>
            ::count(&this->outputs_by_builtin,&local_24);
    bVar8 = sVar6 == 0;
  }
  pMVar4 = local_18;
  if (bVar8) {
    local_28 = local_18->builtin;
    pmVar7 = ::std::
             unordered_map<unsigned_int,_spirv_cross::MSLShaderInterfaceVariable,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>_>
             ::operator[](&this->outputs_by_builtin,&local_28);
    uVar1 = pMVar4->component;
    pmVar7->location = pMVar4->location;
    pmVar7->component = uVar1;
    BVar2 = pMVar4->builtin;
    pmVar7->format = pMVar4->format;
    pmVar7->builtin = BVar2;
    MVar3 = pMVar4->rate;
    pmVar7->vecsize = pMVar4->vecsize;
    pmVar7->rate = MVar3;
  }
  return;
}

Assistant:

void CompilerMSL::add_msl_shader_output(const MSLShaderInterfaceVariable &so)
{
	outputs_by_location[{so.location, so.component}] = so;
	if (so.builtin != BuiltInMax && !outputs_by_builtin.count(so.builtin))
		outputs_by_builtin[so.builtin] = so;
}